

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall Lodtalk::StackFrame::updateMarriedSpouseState(StackFrame *this)

{
  Oop obj;
  uint8_t *puVar1;
  Oop *pOVar2;
  bool bVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar5;
  int local_34;
  int currentTempIndex;
  Oop *temporaryEnd;
  Oop *currentTemporary;
  Context *context;
  StackFrame *this_local;
  
  bVar3 = hasContext(this);
  if (!bVar3) {
    __assert_fail("hasContext()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0x77,"void Lodtalk::StackFrame::updateMarriedSpouseState()");
  }
  paVar4 = &getThisContext(this)->field_0;
  obj.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar4->header;
  bVar3 = isNil((ProtoObject *)obj.field_0);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isNil(context)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0x79,"void Lodtalk::StackFrame::updateMarriedSpouseState()");
  }
  aVar5 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(this->stackPointer + 1);
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)obj.field_0 + 0x18) = aVar5;
  puVar1 = this->framePointer;
  pOVar2 = (Oop *)this->stackPointer;
  local_34 = getArgumentCount(this);
  for (temporaryEnd = (Oop *)(puVar1 + -0x28); pOVar2 <= temporaryEnd;
      temporaryEnd = temporaryEnd + -1) {
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)((ProtoObject *)((long)obj.field_0 + 0x40) + local_34) =
         temporaryEnd->field_0;
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void StackFrame::updateMarriedSpouseState()
{
    assert(hasContext());
    auto context = reinterpret_cast<Context*> (getThisContext().pointer);
    assert(!isNil(context));
    context->stackp = Oop::fromPointer(stackPointer + 1);

    // Copy the temporaries back to the context.
    auto currentTemporary = reinterpret_cast<Oop*> (framePointer + InterpreterStackFrame::FirstTempOffset);
    auto temporaryEnd = reinterpret_cast<Oop*> (stackPointer);
    auto currentTempIndex = getArgumentCount();
    for (;  currentTemporary >= temporaryEnd; --currentTemporary, currentTempIndex++)
        context->data[currentTempIndex] = *currentTemporary;
}